

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_exec(Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  IntrinsicResult *in_RDX;
  double dVar2;
  Value local_1b8;
  Value local_1a8;
  Value local_198;
  Value local_188;
  Value local_178;
  Value local_168;
  Value local_158;
  Value local_148;
  undefined1 local_138 [8];
  ValueDict result;
  int local_10c;
  undefined1 local_108 [4];
  int status;
  String stdErr;
  String stdOut;
  undefined1 local_d8 [8];
  ValueList data;
  Value local_c0;
  String local_b0;
  undefined1 local_a0 [8];
  ValueList data_1;
  undefined1 local_80 [24];
  double timeout;
  undefined1 local_48 [24];
  String cmd;
  double now;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  cmd._8_8_ = MiniScript::Machine::RunTime((Machine *)partialResult[0xe].rs);
  bVar1 = MiniScript::IntrinsicResult::Done(in_RDX);
  if (bVar1) {
    MiniScript::String::String((String *)&stack0xffffffffffffffa8,"cmd");
    MiniScript::Context::GetVar
              ((Context *)local_48,(String *)partialResult,
               (LocalOnlyMode)(String *)&stack0xffffffffffffffa8);
    MiniScript::Value::ToString((Value *)(local_48 + 0x10),(Machine *)local_48);
    MiniScript::Value::~Value((Value *)local_48);
    MiniScript::String::~String((String *)&stack0xffffffffffffffa8);
    MiniScript::String::String((String *)&data_1.isTemp,"timeout");
    MiniScript::Context::GetVar((Context *)local_80,(String *)partialResult,(char)&data_1 + 8);
    dVar2 = MiniScript::Value::DoubleValue((Value *)local_80);
    MiniScript::Value::~Value((Value *)local_80);
    MiniScript::String::~String((String *)&data_1.isTemp);
    local_80._16_8_ = dVar2;
    MiniScript::List<MiniScript::Value>::List((List<MiniScript::Value> *)local_a0,0);
    MiniScript::String::String(&local_b0,(String *)(local_48 + 0x10));
    bVar1 = MiniScript::BeginExec
                      (&local_b0,(double)local_80._16_8_,(double)cmd._8_8_,(ValueList *)local_a0);
    MiniScript::String::~String(&local_b0);
    if (bVar1) {
      MiniScript::Value::Value(&local_c0,(ValueList *)local_a0);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_c0,false);
      MiniScript::Value::~Value(&local_c0);
    }
    else {
      MiniScript::IntrinsicResult::IntrinsicResult
                ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
    }
    data._12_4_ = 1;
    MiniScript::List<MiniScript::Value>::~List((List<MiniScript::Value> *)local_a0);
    MiniScript::String::~String((String *)(local_48 + 0x10));
  }
  else {
    MiniScript::IntrinsicResult::Result((IntrinsicResult *)&stdOut.isTemp);
    MiniScript::Value::GetList((Value *)local_d8);
    MiniScript::Value::~Value((Value *)&stdOut.isTemp);
    MiniScript::String::String((String *)&stdErr.isTemp);
    MiniScript::String::String((String *)local_108);
    local_10c = -1;
    MiniScript::List<MiniScript::Value>::List
              ((List<MiniScript::Value> *)&result.isTemp,(List<MiniScript::Value> *)local_d8);
    bVar1 = MiniScript::FinishExec
                      ((ValueList *)&result.isTemp,(double)cmd._8_8_,(String *)&stdErr.isTemp,
                       (String *)local_108,&local_10c);
    MiniScript::List<MiniScript::Value>::~List((List<MiniScript::Value> *)&result.isTemp);
    if (bVar1) {
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::
      Dictionary((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                 local_138);
      MiniScript::Value::Value(&local_148,"output");
      MiniScript::Value::Value(&local_158,(String *)&stdErr.isTemp);
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                 local_138,&local_148,&local_158);
      MiniScript::Value::~Value(&local_158);
      MiniScript::Value::~Value(&local_148);
      MiniScript::Value::Value(&local_168,"errors");
      MiniScript::Value::Value(&local_178,(String *)local_108);
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                 local_138,&local_168,&local_178);
      MiniScript::Value::~Value(&local_178);
      MiniScript::Value::~Value(&local_168);
      MiniScript::Value::Value(&local_188,"status");
      MiniScript::Value::Value(&local_198,(double)local_10c);
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                 local_138,&local_188,&local_198);
      MiniScript::Value::~Value(&local_198);
      MiniScript::Value::~Value(&local_188);
      MiniScript::Value::Value(&local_1a8,(ValueDict *)local_138);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_1a8,true);
      MiniScript::Value::~Value(&local_1a8);
      data._12_4_ = 1;
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::
      ~Dictionary((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                  local_138);
    }
    else {
      MiniScript::Value::Value(&local_1b8,(ValueList *)local_d8);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_1b8,false);
      MiniScript::Value::~Value(&local_1b8);
      data._12_4_ = 1;
    }
    MiniScript::String::~String((String *)local_108);
    MiniScript::String::~String((String *)&stdErr.isTemp);
    MiniScript::List<MiniScript::Value>::~List((List<MiniScript::Value> *)local_d8);
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_exec(Context *context, IntrinsicResult partialResult) {
	double now = context->vm->RunTime();
	if (partialResult.Done()) {
		// This is the initial entry into `exec`.  Fork a subprocess to execute the
		// given command, and return a partial result we can use to check on its progress.
		String cmd = context->GetVar("cmd").ToString();
		double timeout = context->GetVar("timeout").DoubleValue();
		ValueList data;
		if (BeginExec(cmd, timeout, now, &data)) {
			return IntrinsicResult(data, false);
		}
		return IntrinsicResult::Null;
	}
	
	// This is a subsequent entry to intrinsic_exec, where we've already forked
	// the subprocess, and now we're waiting for it to finish.	al time out of the partial result.
	ValueList data = partialResult.Result().GetList();
	String stdOut, stdErr;
	int status = -1;
	if (FinishExec(data, now, &stdOut, &stdErr, &status)) {
		// All done!
		ValueDict result;
		result.SetValue("output", Value(stdOut));
		result.SetValue("errors", Value(stdErr));
		result.SetValue("status", Value(status));
		return IntrinsicResult(result);
	} else {
		// Not done yet.
		return IntrinsicResult(data, false);
	}
}